

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  int *piVar1;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *pEVar2;
  Type *pTVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  JavascriptLibrary *pJVar5;
  code *pcVar6;
  PropertyRecord *this_01;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  uint uVar7;
  bool bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint32 index;
  int iVar12;
  BOOL BVar13;
  PropertyId propertyId_00;
  undefined4 *puVar14;
  JavascriptString **ppJVar15;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  DictionaryTypeHandlerBase<int> *pDVar16;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_03;
  ScriptContext *this_04;
  undefined7 in_register_00000081;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_58;
  int propertyIndex;
  Var local_48;
  PropertyValueInfo *local_40;
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000081,attributes);
  local_48 = value;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    _propertyIndex = instance;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar8) goto LAB_00de7537;
    *puVar14 = 0;
    instance = _propertyIndex;
  }
  this_04 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)this_04;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_40 = info;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar8) goto LAB_00de7537;
    *puVar14 = 0;
    this_04 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
    info = local_40;
  }
  local_40 = (PropertyValueInfo *)CONCAT44(local_40._4_4_,propertyId);
  local_68 = ScriptContext::GetPropertyName(this_04,propertyId);
  this_00 = (this->propertyMap).ptr;
  uVar11 = JsUtil::
           BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           ::FindEntryWithKey<Js::PropertyRecord_const*>
                     ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                       *)this_00,&local_68);
  uVar7 = local_34;
  if ((int)uVar11 < 0) {
    if (local_68->isNumeric != true) {
      BVar13 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
               AddProperty<Js::PropertyRecord_const*>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                          instance,local_68,local_48,(byte)local_34,info,flags,possibleSideEffects);
      return BVar13;
    }
    index = PropertyRecord::GetNumericValue(local_68);
    BVar13 = DynamicTypeHandler::SetItemWithAttributes
                       (&this->super_DynamicTypeHandler,instance,index,local_48,(byte)local_34);
    return BVar13;
  }
  pEVar2 = (this_00->entries).ptr;
  bVar9 = pEVar2[uVar11].
          super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
          .
          super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .
          super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
          .
          super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
          .
          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
          .value.Attributes;
  if ((bVar9 & 0x10) != ((byte)local_34 & 0x10)) {
    pDVar16 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
              ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                         instance);
    piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->
              convertSimpleDictionaryToDictionaryCount;
    *piVar1 = *piVar1 + 1;
    iVar12 = (*(pDVar16->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                       (pDVar16,instance,(ulong)local_40 & 0xffffffff,local_48,(ulong)(uVar7 & 0xff)
                        ,info,(ulong)flags,(ulong)possibleSideEffects);
    return iVar12;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)(pEVar2 + uVar11);
  if ((bVar9 & 0x18) == 8) {
    bVar9 = (this->super_DynamicTypeHandler).flags;
    if ((bVar9 & 4) != 0) goto LAB_00de7232;
    pTVar3 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar3[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar9 & 0x10) != 0) || (*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x960,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar8) goto LAB_00de7537;
        *puVar14 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    if (((this->field_0x28 & 2) != 0) &&
       (bVar8 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                                     *)this,instance,descriptor->propertyIndex,(int *)&local_58),
       bVar8)) {
      ppJVar15 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->propertyMap).ptr,(int)local_58);
      bVar8 = PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals(*ppJVar15,local_68);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x96b,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                   );
        if (!bVar8) goto LAB_00de7537;
        *puVar14 = 0;
      }
      descriptor = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,(int)local_58);
    }
    bVar8 = SupportsSwitchingToUnordered(this,(ScriptContext *)propertyRecord);
    if (bVar8) {
      this->numDeletedProperties = this->numDeletedProperties + 0xff;
    }
    ScriptContext::InvalidateProtoCaches((ScriptContext *)propertyRecord,(uint)local_40);
    descriptor->Attributes = '\a';
    bVar9 = 7;
  }
  if (bVar9 != (byte)local_34) {
    bVar9 = (this->super_DynamicTypeHandler).flags;
    if ((bVar9 & 4) != 0) {
LAB_00de7232:
      this_03 = ConvertToNonSharedSimpleDictionaryType(this,instance);
      BVar13 = SetPropertyWithAttributes
                         (this_03,instance,(uint)local_40,local_48,(byte)local_34,info,flags,
                          possibleSideEffects);
      return BVar13;
    }
    pTVar3 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar3[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar9 & 0x10) != 0) || (*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x997,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar8) goto LAB_00de7537;
        *puVar14 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    descriptor->Attributes = (PropertyAttributes)local_34;
  }
  if (descriptor->propertyIndex == -1) goto LAB_00de7460;
  pRVar4 = (this->singletonInstance).ptr;
  if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar8 = false;
  }
  else if ((DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef == instance) {
    bVar8 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    _propertyIndex = instance;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9a5,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar8) goto LAB_00de7537;
    *puVar14 = 0;
    bVar8 = false;
    instance = _propertyIndex;
  }
  if ((*(byte *)descriptor & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)descriptor = *(byte *)descriptor | 2, bVar8)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)local_40)) {
      _propertyIndex = instance;
      if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9af,"(!GetIsShared())","!GetIsShared()");
        if (!bVar8) goto LAB_00de7537;
        *puVar14 = 0;
      }
      if (local_48 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b0,"(value != nullptr)","value != nullptr");
        if (!bVar8) goto LAB_00de7537;
        *puVar14 = 0;
      }
      instance = _propertyIndex;
      BVar13 = RecyclableObject::IsExternal(&_propertyIndex->super_RecyclableObject);
      if (BVar13 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar8) {
LAB_00de7537:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar14 = 0;
        instance = _propertyIndex;
      }
      bVar8 = VarIs<Js::JavascriptFunction>(local_48);
      if (bVar8) {
        bVar8 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar9 = *(byte *)descriptor;
        if (bVar8) goto LAB_00de7529;
LAB_00de7525:
        bVar10 = 4;
      }
      else {
        bVar8 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar8) {
          bVar9 = *(byte *)descriptor;
        }
        else {
          bVar8 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                            (instance,(uint)local_40,local_48);
          bVar9 = *(byte *)descriptor;
          if (bVar8) goto LAB_00de7525;
        }
LAB_00de7529:
        bVar10 = 0;
      }
      *(byte *)descriptor = bVar9 & 0xfb | bVar10;
    }
  }
  else {
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,local_68,
               descriptor,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,descriptor->propertyIndex,local_48);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00de7460:
  if ((descriptor->Attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  pJVar5 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  Memory::Recycler::WBSetBit((char *)&local_58);
  local_58 = &pJVar5->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
  this_02 = local_58;
  if (((descriptor->Attributes & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
     this_01 = propertyRecord, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    propertyId_00 =
         DynamicTypeHandler::TMapKey_GetPropertyId((ScriptContext *)propertyRecord,(uint)local_40);
    ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_01,propertyId_00);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_02);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,(uint)local_40,local_48,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }